

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyRemoveNode(Node *node)

{
  Node *node_local;
  
  if (node->prev != (Node *)0x0) {
    node->prev->next = node->next;
  }
  if (node->next != (Node *)0x0) {
    node->next->prev = node->prev;
  }
  if (node->parent != (Node *)0x0) {
    if (node->parent->content == node) {
      node->parent->content = node->next;
    }
    if (node->parent->last == node) {
      node->parent->last = node->prev;
    }
  }
  node->next = (Node *)0x0;
  node->prev = (Node *)0x0;
  node->parent = (Node *)0x0;
  return node;
}

Assistant:

Node *TY_(RemoveNode)(Node *node)
{
    if (node->prev)
        node->prev->next = node->next;

    if (node->next)
        node->next->prev = node->prev;

    if (node->parent)
    {
        if (node->parent->content == node)
            node->parent->content = node->next;

        if (node->parent->last == node)
            node->parent->last = node->prev;
    }

    node->parent = node->prev = node->next = NULL;
    return node;
}